

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::semantic_rule<jsonip::grammar::double_,jsonip::parser::number_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *pppVar1;
  PositionType pcVar2;
  semantic_state *this;
  pointer ppVar3;
  helper *phVar4;
  bool bVar5;
  long *local_58;
  int local_50;
  long local_48 [2];
  double local_38;
  
  pcVar2 = state->reader_->pos_;
  bVar5 = seq_<jsonip::parser::opt_<jsonip::parser::char_<(char)45>>,jsonip::parser::positive_,jsonip::parser::opt_<jsonip::parser::seq_<jsonip::parser::dot,jsonip::parser::positive_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::opt_<jsonip::parser::seq_<jsonip::parser::e_,jsonip::parser::positive_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
  ;
  if (bVar5) {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,state->reader_->pos_)
    ;
    local_38 = parse_double((char *)local_58,local_50);
    this = state->ss_;
    semantic_state::pre(this);
    ppVar3 = (this->state).
             super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    phVar4 = ppVar3[-1].second;
    (*phVar4->_vptr_helper[2])(local_38,phVar4,ppVar3 + -1);
    pppVar1 = &(this->state).
               super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + -1;
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  return bVar5;
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }